

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QDate __thiscall
QLocale::toDate(QLocale *this,QString *string,FormatType format,QCalendar cal,int baseYear)

{
  QDate QVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  dateFormat((QString *)&QStack_48,this,format);
  QVar1 = toDate(this,string,(QString *)&QStack_48,cal,baseYear);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDate)QVar1.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QLocale::toDate(const QString &string, FormatType format, QCalendar cal, int baseYear) const
{
    return toDate(string, dateFormat(format), cal, baseYear);
}